

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

void __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::GenericDocument(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  *this,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator,size_t stackCapacity
                 ,CrtAllocator *stackAllocator)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_00;
  
  (this->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.n = (Number)0x0;
  (this->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.s.str = (Ch *)0x0;
  this->allocator_ = allocator;
  this->ownAllocator_ = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  (this->stack_).allocator_ = stackAllocator;
  (this->stack_).ownAllocator_ = (CrtAllocator *)0x0;
  (this->stack_).stack_ = (char *)0x0;
  (this->stack_).stackTop_ = (char *)0x0;
  (this->stack_).stackEnd_ = (char *)0x0;
  (this->stack_).initialCapacity_ = stackCapacity;
  (this->parseResult_).code_ = kParseErrorNone;
  (this->parseResult_).offset_ = 0;
  if (allocator == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
    this_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)operator_new(0x18);
    MemoryPoolAllocator<rapidjson::CrtAllocator>::MemoryPoolAllocator
              (this_00,0x10000,(CrtAllocator *)0x0);
    this->allocator_ = this_00;
    this->ownAllocator_ = this_00;
  }
  return;
}

Assistant:

GenericValue() RAPIDJSON_NOEXCEPT : data_() { data_.f.flags = kNullFlag; }